

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O2

void __thiscall
wabt::AST::Get<(wabt::ExprType)26>(AST *this,VarExpr<(wabt::ExprType)26> *ve,bool local)

{
  size_t sVar1;
  string *psVar2;
  undefined7 in_register_00000011;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>,_bool>
  pVar3;
  reference rVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
  local_60;
  
  if ((int)CONCAT71(in_register_00000011,local) != 0) {
    psVar2 = Var::name_abi_cxx11_(&ve->var);
    sVar1 = this->cur_block_id;
    std::__cxx11::string::string((string *)&local_60,(string *)psVar2);
    local_60.second.defined = false;
    local_60.second.block_id = sVar1;
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
                        *)&this->vars_defined,&local_60);
    std::__cxx11::string::_M_dispose();
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->blocks_closed,*(size_type *)(pVar3.first._M_node._M_node + 2));
      if ((*rVar4._M_p & rVar4._M_mask) == 0) goto LAB_0015663d;
    }
    PreDecl<(wabt::ExprType)26>(this,ve);
  }
LAB_0015663d:
  InsertNode(this,Expr,LocalTee,(Expr *)ve,0);
  return;
}

Assistant:

void Get(const VarExpr<T>& ve, bool local) {
    if (local) {
      auto ret = vars_defined.insert({ve.var.name(), {cur_block_id, false}});
      if (ret.second) {
        // Use before def, may happen since locals are guaranteed 0.
        PreDecl(ve);
      } else if (blocks_closed[ret.first->second.block_id]) {
        // This is a use of a variable that was defined in a block that has
        // already ended. This happens rarely, but we should cater for this
        // case by lifting it to the top scope.
        PreDecl(ve);
      }
    }
    InsertNode(NodeType::Expr, T, &ve, 0);
  }